

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<long,unsigned_long>
          (string *__return_storage_ptr__,internal *this,long *value,unsigned_long *param_2)

{
  unsigned_long *param_1_local;
  long *value_local;
  
  PrintToString<long>(__return_storage_ptr__,(long *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}